

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status fdb_doc_free(fdb_doc *doc)

{
  if (doc != (fdb_doc *)0x0) {
    free(doc->key);
    free(doc->meta);
    free(doc->body);
    free(doc);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

LIBFDB_API
fdb_status fdb_doc_free(fdb_doc *doc)
{
    if (doc) {
        free(doc->key);
        free(doc->meta);
        free(doc->body);
        free(doc);
    }
    return FDB_RESULT_SUCCESS;
}